

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-loader.c++
# Opt level: O1

Maybe<capnp::compiler::Module_&> __thiscall
capnp::compiler::ModuleLoader::Impl::loadModule(Impl *this,ReadableDirectory *dir,PathPtr path)

{
  _Hashtable<capnp::compiler::(anonymous_namespace)::FileKey,_std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_std::allocator<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>_>,_std::__detail::_Select1st,_std::equal_to<capnp::compiler::(anonymous_namespace)::FileKey>,_capnp::compiler::(anonymous_namespace)::FileKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_00;
  _Hash_node_base *p_Var1;
  _Hash_node_base *p_Var2;
  ReadableDirectory *pRVar3;
  __buckets_ptr pp_Var4;
  undefined8 *puVar5;
  ReadableFile *pRVar6;
  size_t sVar7;
  ReadableDirectory *pRVar8;
  __node_ptr p_Var9;
  __node_ptr p_Var10;
  ReadableDirectory *__s;
  _Hash_node_base *p_Var11;
  String *pSVar12;
  _Hashtable<capnp::compiler::(anonymous_namespace)::FileKey,_std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_std::allocator<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>_>,_std::__detail::_Select1st,_std::equal_to<capnp::compiler::(anonymous_namespace)::FileKey>,_capnp::compiler::(anonymous_namespace)::FileKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *params_2;
  void *__child_stack;
  ulong uVar13;
  _func_int **pp_Var14;
  ulong uVar15;
  _Hash_node_base *p_Var16;
  void *in_R8;
  ulong __c;
  __node_ptr p_Var17;
  undefined1 auVar18 [16];
  __buckets_alloc_type __alloc;
  Own<capnp::compiler::ModuleLoader::ModuleImpl,_std::nullptr_t> module;
  OwnOwn<const_kj::ReadableFile,_std::nullptr_t> _file242;
  Path pathCopy;
  new_allocator<std::__detail::_Hash_node_base_*> local_f1;
  undefined8 *local_f0;
  _func_int **local_e8;
  Own<const_kj::ReadableFile,_std::nullptr_t> local_e0;
  __node_ptr local_d0;
  _Hashtable<capnp::compiler::(anonymous_namespace)::FileKey,_std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_std::allocator<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>_>,_std::__detail::_Select1st,_std::equal_to<capnp::compiler::(anonymous_namespace)::FileKey>,_capnp::compiler::(anonymous_namespace)::FileKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_c8;
  String *local_c0;
  Path local_b8;
  __node_ptr local_a0;
  void *local_98;
  undefined8 *local_90;
  Impl *local_88;
  ReadableFile *local_80;
  __node_ptr local_78;
  ReadableDirectory *local_70;
  key_type local_68;
  
  local_a0 = (__node_ptr)path.parts.size_;
  params_2 = (_Hashtable<capnp::compiler::(anonymous_namespace)::FileKey,_std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_std::allocator<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>_>,_std::__detail::_Select1st,_std::equal_to<capnp::compiler::(anonymous_namespace)::FileKey>,_capnp::compiler::(anonymous_namespace)::FileKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              *)path.parts.ptr;
  local_68.size = 0;
  local_68.lastModified.value.value = (Quantity<long,_kj::_::NanosecondLabel>)0;
  local_68.file.ptr = (ReadableFile *)0x0;
  local_68.hashCode = 0;
  this_00 = (_Hashtable<capnp::compiler::(anonymous_namespace)::FileKey,_std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_std::allocator<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>_>,_std::__detail::_Select1st,_std::equal_to<capnp::compiler::(anonymous_namespace)::FileKey>,_capnp::compiler::(anonymous_namespace)::FileKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             *)(dir + 5);
  local_98 = in_R8;
  local_68.baseDir = (ReadableDirectory *)params_2;
  local_68.path.parts.ptr = (String *)local_a0;
  p_Var9 = std::
           _Hashtable<capnp::compiler::(anonymous_namespace)::FileKey,_std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_std::allocator<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>_>,_std::__detail::_Select1st,_std::equal_to<capnp::compiler::(anonymous_namespace)::FileKey>,_capnp::compiler::(anonymous_namespace)::FileKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_node(this_00,0 % (ulong)dir[6].super_FsNode._vptr_FsNode,&local_68,0);
  if (p_Var9 == (__node_ptr)0x0) {
    (*(code *)params_2->_M_buckets[10])(&local_68,params_2,local_a0,local_98);
    local_e0.disposer = (Disposer *)local_68.baseDir;
    local_e0.ptr = (ReadableFile *)local_68.path.parts.ptr;
    if ((__node_ptr)local_68.path.parts.ptr == (__node_ptr)0x0) {
      this->errorReporter = (GlobalErrorReporter *)0x0;
    }
    else {
      kj::PathPtr::clone((PathPtr *)&local_b8,(__fn *)&local_a0,__child_stack,
                         (int)local_68.path.parts.ptr,in_R8);
      pRVar6 = local_e0.ptr;
      local_c0 = local_b8.parts.ptr;
      local_c8 = (_Hashtable<capnp::compiler::(anonymous_namespace)::FileKey,_std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_std::allocator<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>_>,_std::__detail::_Select1st,_std::equal_to<capnp::compiler::(anonymous_namespace)::FileKey>,_capnp::compiler::(anonymous_namespace)::FileKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)local_b8.parts.size_;
      (*(code *)((_Hash_node_base *)&(local_e0.ptr)->super_FsNode)->_M_nxt[2]._M_nxt)
                (&local_68,local_e0.ptr);
      local_78 = (__node_ptr)local_68.path.parts.ptr;
      local_80 = local_68.file.ptr;
      local_d0 = (__node_ptr)local_68.size;
      local_70 = dir;
      kj::
      heap<capnp::compiler::ModuleLoader::ModuleImpl,capnp::compiler::ModuleLoader::Impl&,kj::Own<kj::ReadableFile_const,decltype(nullptr)>,kj::ReadableDirectory_const&,kj::Path>
                ((kj *)&local_f0,(Impl *)dir,&local_e0,(ReadableDirectory *)params_2,&local_b8);
      pp_Var14 = local_e8;
      puVar5 = local_f0;
      local_e8 = (_func_int **)0x0;
      local_90 = local_f0;
      local_88 = this;
      local_68.baseDir = (ReadableDirectory *)this_00;
      p_Var10 = (__node_ptr)operator_new(0x58);
      pRVar8 = local_70;
      (p_Var10->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
      *(_Hashtable<capnp::compiler::(anonymous_namespace)::FileKey,_std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_std::allocator<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>_>,_std::__detail::_Select1st,_std::equal_to<capnp::compiler::(anonymous_namespace)::FileKey>,_capnp::compiler::(anonymous_namespace)::FileKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        **)&(p_Var10->
            super__Hash_node_value<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_true>
            ).
            super__Hash_node_value_base<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>_>
            ._M_storage._M_storage = params_2;
      *(String **)
       ((long)&(p_Var10->
               super__Hash_node_value<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_true>
               ).
               super__Hash_node_value_base<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>_>
               ._M_storage._M_storage + 8) = local_c0;
      *(_Hashtable<capnp::compiler::(anonymous_namespace)::FileKey,_std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_std::allocator<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>_>,_std::__detail::_Select1st,_std::equal_to<capnp::compiler::(anonymous_namespace)::FileKey>,_capnp::compiler::(anonymous_namespace)::FileKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        **)((long)&(p_Var10->
                   super__Hash_node_value<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_true>
                   ).
                   super__Hash_node_value_base<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>_>
                   ._M_storage._M_storage + 0x10) = local_c8;
      *(ReadableFile **)
       ((long)&(p_Var10->
               super__Hash_node_value<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_true>
               ).
               super__Hash_node_value_base<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>_>
               ._M_storage._M_storage + 0x18) = pRVar6;
      *(__node_ptr *)
       ((long)&(p_Var10->
               super__Hash_node_value<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_true>
               ).
               super__Hash_node_value_base<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>_>
               ._M_storage._M_storage + 0x20) = local_d0;
      *(__node_ptr *)
       ((long)&(p_Var10->
               super__Hash_node_value<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_true>
               ).
               super__Hash_node_value_base<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>_>
               ._M_storage._M_storage + 0x28) = local_78;
      *(ReadableFile **)
       ((long)&(p_Var10->
               super__Hash_node_value<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_true>
               ).
               super__Hash_node_value_base<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>_>
               ._M_storage._M_storage + 0x30) = local_80;
      *(undefined8 **)
       ((long)&(p_Var10->
               super__Hash_node_value<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_true>
               ).
               super__Hash_node_value_base<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>_>
               ._M_storage._M_storage + 0x38) = puVar5;
      local_c0 = (String *)pp_Var14;
      *(_func_int ***)
       ((long)&(p_Var10->
               super__Hash_node_value<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_true>
               ).
               super__Hash_node_value_base<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>_>
               ._M_storage._M_storage + 0x40) = pp_Var14;
      __c = (long)local_d0 +
            *(long *)((long)&(p_Var10->
                             super__Hash_node_value<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_true>
                             ).
                             super__Hash_node_value_base<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>_>
                             ._M_storage._M_storage + 0x28) * 0x67 +
            *(long *)((long)&(p_Var10->
                             super__Hash_node_value<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_true>
                             ).
                             super__Hash_node_value_base<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>_>
                             ._M_storage._M_storage + 0x30) * 0x49;
      uVar13 = __c % (ulong)local_70[6].super_FsNode._vptr_FsNode;
      local_68.path.parts.ptr = (String *)p_Var10;
      p_Var9 = std::
               _Hashtable<capnp::compiler::(anonymous_namespace)::FileKey,_std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_std::allocator<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>_>,_std::__detail::_Select1st,_std::equal_to<capnp::compiler::(anonymous_namespace)::FileKey>,_capnp::compiler::(anonymous_namespace)::FileKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::_M_find_node(this_00,uVar13,
                              (key_type *)
                              &p_Var10->
                               super__Hash_node_value<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_true>
                              ,__c);
      p_Var17 = p_Var9;
      local_c8 = this_00;
      if (p_Var9 == (__node_ptr)0x0) {
        local_d0 = p_Var9;
        auVar18 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                            ((ulong)(pRVar8 + 9),(ulong)pRVar8[6].super_FsNode._vptr_FsNode,
                             (ulong)pRVar8[8].super_FsNode._vptr_FsNode);
        pp_Var14 = auVar18._8_8_;
        if ((auVar18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          if (pp_Var14 == (_func_int **)0x1) {
            __s = pRVar8 + 0xb;
            pRVar8[0xb].super_FsNode._vptr_FsNode = (_func_int **)0x0;
          }
          else {
            __s = (ReadableDirectory *)
                  __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                            (&local_f1,(size_type)pp_Var14,(void *)0x0);
            memset(__s,0,(long)pp_Var14 * 8);
          }
          p_Var16 = (_Hash_node_base *)pRVar8[7].super_FsNode._vptr_FsNode;
          pRVar8[7].super_FsNode._vptr_FsNode = (_func_int **)0x0;
          if (p_Var16 != (_Hash_node_base *)0x0) {
            p_Var1 = (_Hash_node_base *)(pRVar8 + 7);
            uVar13 = 0;
            do {
              p_Var2 = p_Var16->_M_nxt;
              uVar15 = (ulong)p_Var16[10]._M_nxt % (ulong)pp_Var14;
              p_Var11 = (_Hash_node_base *)__s[uVar15].super_FsNode._vptr_FsNode;
              if (p_Var11 == (_Hash_node_base *)0x0) {
                p_Var16->_M_nxt = p_Var1->_M_nxt;
                p_Var1->_M_nxt = p_Var16;
                __s[uVar15].super_FsNode._vptr_FsNode = (_func_int **)p_Var1;
                if (p_Var16->_M_nxt != (_Hash_node_base *)0x0) {
                  p_Var11 = (_Hash_node_base *)(__s + uVar13);
                  goto LAB_00113efb;
                }
              }
              else {
                p_Var16->_M_nxt = p_Var11->_M_nxt;
                p_Var11 = (_Hash_node_base *)__s[uVar15].super_FsNode._vptr_FsNode;
                uVar15 = uVar13;
LAB_00113efb:
                p_Var11->_M_nxt = p_Var16;
              }
              p_Var16 = p_Var2;
              uVar13 = uVar15;
            } while (p_Var2 != (_Hash_node_base *)0x0);
          }
          pRVar3 = (ReadableDirectory *)pRVar8[5].super_FsNode._vptr_FsNode;
          if (pRVar8 + 0xb != pRVar3) {
            operator_delete(pRVar3,(long)pRVar8[6].super_FsNode._vptr_FsNode << 3);
          }
          pRVar8[6].super_FsNode._vptr_FsNode = pp_Var14;
          pRVar8[5].super_FsNode._vptr_FsNode = (_func_int **)__s;
          uVar13 = __c % (ulong)pp_Var14;
        }
        (p_Var10->
        super__Hash_node_value<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_true>
        ).super__Hash_node_code_cache<true>._M_hash_code = __c;
        pp_Var4 = local_c8->_M_buckets;
        if (pp_Var4[uVar13] == (__node_base_ptr)0x0) {
          p_Var16 = (_Hash_node_base *)pRVar8[7].super_FsNode._vptr_FsNode;
          (p_Var10->super__Hash_node_base)._M_nxt = p_Var16;
          pRVar8[7].super_FsNode._vptr_FsNode = (_func_int **)p_Var10;
          if (p_Var16 != (_Hash_node_base *)0x0) {
            pp_Var4[(ulong)p_Var16[10]._M_nxt % (ulong)pRVar8[6].super_FsNode._vptr_FsNode] =
                 (__node_base_ptr)p_Var10;
          }
          local_c8->_M_buckets[uVar13] = (__node_base_ptr)(pRVar8 + 7);
        }
        else {
          (p_Var10->super__Hash_node_base)._M_nxt = pp_Var4[uVar13]->_M_nxt;
          pp_Var4[uVar13]->_M_nxt = (_Hash_node_base *)p_Var10;
        }
        pRVar8[8].super_FsNode._vptr_FsNode =
             (_func_int **)((long)pRVar8[8].super_FsNode._vptr_FsNode + 1);
        local_68.path.parts.ptr = (String *)0x0;
        p_Var9 = p_Var10;
        p_Var17 = local_d0;
      }
      std::
      _Hashtable<capnp::compiler::(anonymous_namespace)::FileKey,_std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_std::allocator<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>_>,_std::__detail::_Select1st,_std::equal_to<capnp::compiler::(anonymous_namespace)::FileKey>,_capnp::compiler::(anonymous_namespace)::FileKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_Scoped_node::~_Scoped_node((_Scoped_node *)&local_68);
      this = local_88;
      pp_Var14 = local_e8;
      pSVar12 = local_c0;
      if (p_Var17 != (__node_ptr)0x0) {
        pSVar12 = *(String **)
                   ((long)&(p_Var9->
                           super__Hash_node_value<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_true>
                           ).
                           super__Hash_node_value_base<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>_>
                           ._M_storage._M_storage + 0x40);
      }
      ((ErrorReporter *)&local_88->errorReporter)->_vptr_ErrorReporter = (_func_int **)pSVar12;
      if (local_e8 != (_func_int **)0x0) {
        local_e8 = (_func_int **)0x0;
        (**(code **)*local_f0)(local_f0,(long)pp_Var14 + *(long *)(*pp_Var14 + -0x10));
      }
      sVar7 = local_b8.parts.size_;
      pSVar12 = local_b8.parts.ptr;
      if (local_b8.parts.ptr != (String *)0x0) {
        local_b8.parts.ptr = (String *)0x0;
        local_b8.parts.size_ = 0;
        (**(local_b8.parts.disposer)->_vptr_ArrayDisposer)
                  (local_b8.parts.disposer,pSVar12,0x18,sVar7,sVar7,
                   kj::ArrayDisposer::Dispose_<kj::String>::destruct);
      }
    }
    pRVar6 = local_e0.ptr;
    if ((__node_ptr)local_e0.ptr != (__node_ptr)0x0) {
      local_e0.ptr = (ReadableFile *)0x0;
      (*(code *)*(local_e0.disposer)->_vptr_Disposer)
                (local_e0.disposer,
                 (long)&((_Hash_node_base *)&pRVar6->super_FsNode)->_M_nxt +
                 (long)((_Hash_node_base *)&pRVar6->super_FsNode)->_M_nxt[-2]._M_nxt);
    }
  }
  else {
    this->errorReporter =
         *(GlobalErrorReporter **)
          ((long)&(p_Var9->
                  super__Hash_node_value<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>,_true>
                  ).
                  super__Hash_node_value_base<std::pair<const_capnp::compiler::(anonymous_namespace)::FileKey,_kj::Own<capnp::compiler::Module,_std::nullptr_t>_>_>
                  ._M_storage._M_storage + 0x40);
  }
  return (Maybe<capnp::compiler::Module_&>)(Module *)this;
}

Assistant:

kj::Maybe<Module&> ModuleLoader::Impl::loadModule(
    const kj::ReadableDirectory& dir, kj::PathPtr path) {
  auto iter = modules.find(FileKey(dir, path));
  if (iter != modules.end()) {
    // Return existing file.
    return *iter->second;
  }

  KJ_IF_SOME(file, dir.tryOpenFile(path)) {
    auto pathCopy = path.clone();
    auto key = FileKey(dir, pathCopy, *file);
    auto module = kj::heap<ModuleImpl>(*this, kj::mv(file), dir, kj::mv(pathCopy));
    auto& result = *module;
    auto insertResult = modules.insert(std::make_pair(key, kj::mv(module)));
    if (insertResult.second) {
      return result;
    } else {
      // Now that we have the file open, we noticed a collision. Return the old file.
      return *insertResult.first->second;
    }
  } else {
    // No such file.
    return kj::none;
  }